

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandLutpack(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  Lpk_Par_t Pars;
  
  Abc_FrameReadNtk(pAbc);
  pNtk = Abc_FrameReadNtk(pAbc);
  Pars.nLutsMax = 0;
  Pars.nLutsOver = 0;
  Pars.nVarsShared = 0;
  Pars.nGrowthLevel = 0;
  Pars.fSatur = 0;
  Pars.fZeroCost = 0;
  Pars.fFirst = 0;
  Pars.fOldAlgo = 0;
  Pars.fVerbose = 0;
  Pars.fVeryVerbose = 0;
  Pars.nLutSize = 0;
  Pars.nVarsMax = 0;
  local_84 = 0;
  Extra_UtilGetoptReset();
  local_78 = 1;
  local_8c = 3;
  local_90 = 4;
  local_88 = 0;
  local_7c = 0;
  local_80 = 0;
  local_74 = 0;
  local_70 = 0;
  local_6c = 0;
LAB_002228cd:
  iVar1 = Extra_UtilGetopt(argc,argv,"NQSLszfovwh");
  iVar2 = globalUtilOptind;
  switch(iVar1) {
  case 0x6f:
    local_74 = local_74 ^ 1;
    goto LAB_002228cd;
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x78:
  case 0x79:
    goto switchD_002228f9_caseD_4d;
  case 0x73:
    local_78 = local_78 ^ 1;
    goto LAB_002228cd;
  case 0x76:
    local_70 = local_70 ^ 1;
    goto LAB_002228cd;
  case 0x77:
    local_6c = local_6c ^ 1;
    goto LAB_002228cd;
  case 0x7a:
    local_7c = local_7c ^ 1;
    goto LAB_002228cd;
  }
  switch(iVar1) {
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_88 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if (1000000000 < local_88) goto switchD_002228f9_caseD_4d;
      goto LAB_002228cd;
    }
    pcVar3 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x52:
    goto switchD_002228f9_caseD_4d;
  case 0x4e:
    if (globalUtilOptind < argc) {
      local_90 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if (local_90 - 0x11 < 0xfffffff1) goto switchD_002228f9_caseD_4d;
      goto LAB_002228cd;
    }
    pcVar3 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x51:
    if (globalUtilOptind < argc) {
      local_8c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if (8 < local_8c) goto switchD_002228f9_caseD_4d;
      goto LAB_002228cd;
    }
    pcVar3 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
      break;
    }
    local_84 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if (4 < local_84) {
switchD_002228f9_caseD_4d:
      iVar2 = -2;
      Abc_Print(-2,"usage: lutpack [-NQSL <num>] [-szfovwh]\n");
      Abc_Print(-2,"\t           performs \"rewriting\" for LUT network;\n");
      Abc_Print(-2,"\t           determines LUT size as the max fanin count of a node;\n");
      Abc_Print(-2,"\t           if the network is not LUT-mapped, packs it into 6-LUTs\n");
      Abc_Print(-2,
                "\t           (there is another command for resynthesis after LUT mapping, \"mfs2\")\n"
               );
      Abc_Print(-2,
                "\t-N <num> : the max number of LUTs in the structure (2 <= num) [default = %d]\n",
                (ulong)local_90);
      Abc_Print(-2,"\t-Q <num> : the max number of LUTs not in MFFC (0 <= num) [default = %d]\n",
                (ulong)local_8c);
      Abc_Print(-2,
                "\t-S <num> : the max number of LUT inputs shared (0 <= num <= 3) [default = %d]\n",
                (ulong)local_84);
      Abc_Print(-2,"\t-L <num> : max level increase after resynthesis (0 <= num) [default = %d]\n",
                (ulong)local_88);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (local_78 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s       : toggle iteration till saturation [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_7c == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-z       : toggle zero-cost replacements [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_80 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-f       : toggle using only first node and first cut [default = %s]\n",pcVar3
               );
      pcVar3 = "yes";
      if (local_74 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-o       : toggle using old implementation [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_70 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar3);
      if (local_6c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle detailed printout of decomposed functions [default = %s]\n",
                pcVar4);
      pcVar3 = "\t-h       : print the command usage\n";
LAB_00222c21:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
    goto LAB_002228cd;
  default:
    if (iVar1 != 0x66) {
      if (iVar1 == -1) {
        Pars.fVeryVerbose = local_6c;
        Pars.fVerbose = local_70;
        Pars.fOldAlgo = local_74;
        Pars.fFirst = local_80;
        Pars.fZeroCost = local_7c;
        Pars.fSatur = local_78;
        Pars.nGrowthLevel = local_88;
        Pars.nVarsShared = local_84;
        Pars.nLutsOver = local_8c;
        Pars.nLutsMax = local_90;
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else if (pNtk->ntkType == ABC_NTK_LOGIC) {
          if (3 < local_84) {
            Abc_Print(-1,"The number of shared variables (%d) is not in the range 0 <= S <= 3.\n");
            return 1;
          }
          iVar2 = Lpk_Resynthesize(pNtk,&Pars);
          if (iVar2 != 0) {
            return 0;
          }
          pcVar3 = "Resynthesis has failed.\n";
        }
        else {
          pcVar3 = "This command can only be applied to a logic network.\n";
        }
        iVar2 = -1;
        goto LAB_00222c21;
      }
      goto switchD_002228f9_caseD_4d;
    }
    local_80 = local_80 ^ 1;
    goto LAB_002228cd;
  }
  Abc_Print(-1,pcVar3);
  goto switchD_002228f9_caseD_4d;
}

Assistant:

int Abc_CommandLutpack( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Lpk_Par_t Pars, * pPars = &Pars;
    int c;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    memset( pPars, 0, sizeof(Lpk_Par_t) );
    pPars->nLutsMax     =  4; // (N) the maximum number of LUTs in the structure
    pPars->nLutsOver    =  3; // (Q) the maximum number of LUTs not in the MFFC
    pPars->nVarsShared  =  0; // (S) the maximum number of shared variables (crossbars)
    pPars->nGrowthLevel =  0; // (L) the maximum number of increased levels
    pPars->fSatur       =  1;
    pPars->fZeroCost    =  0;
    pPars->fFirst       =  0;
    pPars->fOldAlgo     =  0;
    pPars->fVerbose     =  0;
    pPars->fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NQSLszfovwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutsMax < 2 || pPars->nLutsMax > 16 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutsOver = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutsOver < 0 || pPars->nLutsOver > 8 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVarsShared = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVarsShared < 0 || pPars->nVarsShared > 4 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < 0 || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 's':
            pPars->fSatur ^= 1;
            break;
        case 'z':
            pPars->fZeroCost ^= 1;
            break;
        case 'f':
            pPars->fFirst ^= 1;
            break;
        case 'o':
            pPars->fOldAlgo ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    if ( pPars->nVarsShared < 0 || pPars->nVarsShared > 3 )
    {
        Abc_Print( -1, "The number of shared variables (%d) is not in the range 0 <= S <= 3.\n", pPars->nVarsShared );
        return 1;
    }

    // modify the current network
    if ( !Lpk_Resynthesize( pNtk, pPars ) )
    {
        Abc_Print( -1, "Resynthesis has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: lutpack [-NQSL <num>] [-szfovwh]\n" );
    Abc_Print( -2, "\t           performs \"rewriting\" for LUT network;\n" );
    Abc_Print( -2, "\t           determines LUT size as the max fanin count of a node;\n" );
    Abc_Print( -2, "\t           if the network is not LUT-mapped, packs it into 6-LUTs\n" );
    Abc_Print( -2, "\t           (there is another command for resynthesis after LUT mapping, \"mfs2\")\n" );
    Abc_Print( -2, "\t-N <num> : the max number of LUTs in the structure (2 <= num) [default = %d]\n", pPars->nLutsMax );
    Abc_Print( -2, "\t-Q <num> : the max number of LUTs not in MFFC (0 <= num) [default = %d]\n", pPars->nLutsOver );
    Abc_Print( -2, "\t-S <num> : the max number of LUT inputs shared (0 <= num <= 3) [default = %d]\n", pPars->nVarsShared );
    Abc_Print( -2, "\t-L <num> : max level increase after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-s       : toggle iteration till saturation [default = %s]\n", pPars->fSatur? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggle zero-cost replacements [default = %s]\n", pPars->fZeroCost? "yes": "no" );
    Abc_Print( -2, "\t-f       : toggle using only first node and first cut [default = %s]\n", pPars->fFirst? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggle using old implementation [default = %s]\n", pPars->fOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle detailed printout of decomposed functions [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}